

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::uhugeint_t,_duckdb::uhugeint_t>(uhugeint_t input)

{
  uhugeint_t input_00;
  uhugeint_t input_01;
  bool bVar1;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar2;
  uint64_t in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string asStack_1d8 [32];
  string asStack_1b8 [32];
  string asStack_198 [32];
  string asStack_178 [32];
  string asStack_158 [32];
  string asStack_138 [7];
  PhysicalType in_stack_fffffffffffffecf;
  string asStack_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f8;
  undefined8 uStack_f0;
  string asStack_e8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string asStack_98 [32];
  string asStack_78 [32];
  string asStack_58 [32];
  string asStack_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  undefined8 uStack_10;
  
  psVar2 = in_RDI;
  pbStack_18 = in_RSI;
  uStack_10 = in_RDX;
  bVar1 = TypeIsNumber<duckdb::uhugeint_t>();
  if ((bVar1) && (bVar1 = TypeIsNumber<duckdb::uhugeint_t>(), bVar1)) {
    GetTypeId<duckdb::uhugeint_t>();
    __rhs = &bStack_b8;
    TypeIdToString(in_stack_fffffffffffffecf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>((char *)in_RDI,__rhs);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)__rhs);
    pbStack_f8 = pbStack_18;
    uStack_f0 = uStack_10;
    input_00.upper = in_stack_fffffffffffffdf8;
    input_00.lower = (uint64_t)psVar2;
    ConvertToString::Operation<duckdb::uhugeint_t>(input_00);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)__rhs);
    GetTypeId<duckdb::uhugeint_t>();
    TypeIdToString(in_stack_fffffffffffffecf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    ::std::__cxx11::string::~string(asStack_118);
    ::std::__cxx11::string::~string(asStack_38);
    ::std::__cxx11::string::~string(asStack_58);
    ::std::__cxx11::string::~string(asStack_e8);
    ::std::__cxx11::string::~string(asStack_78);
    ::std::__cxx11::string::~string(asStack_98);
    ::std::__cxx11::string::~string((string *)&bStack_b8);
  }
  else {
    GetTypeId<duckdb::uhugeint_t>();
    TypeIdToString(in_stack_fffffffffffffecf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((char *)in_RDI,in_stack_fffffffffffffde0);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)in_stack_fffffffffffffde0);
    input_01.upper = in_stack_fffffffffffffdf8;
    input_01.lower = (uint64_t)psVar2;
    ConvertToString::Operation<duckdb::uhugeint_t>(input_01);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbStack_18,in_stack_fffffffffffffe10);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               (char *)in_stack_fffffffffffffde0);
    GetTypeId<duckdb::uhugeint_t>();
    TypeIdToString(in_stack_fffffffffffffecf);
    ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
              (pbStack_18,in_stack_fffffffffffffe10);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
    ::std::__cxx11::string::~string(asStack_138);
    ::std::__cxx11::string::~string(asStack_158);
    ::std::__cxx11::string::~string(asStack_1d8);
    ::std::__cxx11::string::~string(asStack_178);
    ::std::__cxx11::string::~string(asStack_198);
    ::std::__cxx11::string::~string(asStack_1b8);
  }
  return psVar2;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}